

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie.cc
# Opt level: O2

hbtrie_result hbtrie_prev(hbtrie_iterator *it,void *key_buf,size_t *keylen,void *value_buf)

{
  list_elem *plVar1;
  hbtrie_result hVar2;
  byte bVar3;
  btreeit_item *item;
  uint8_t in_R9B;
  
  if ((~it->flags & 3) == 0) {
    return HBTRIE_RESULT_FAIL;
  }
  plVar1 = (it->btreeit_list).head;
  item = (btreeit_item *)(plVar1 + -7);
  if (plVar1 == (list_elem *)0x0) {
    item = (btreeit_item *)0x0;
  }
  hVar2 = _hbtrie_prev(it,item,key_buf,keylen,value_buf,in_R9B);
  bVar3 = it->flags & 0xf8 | 5;
  if (hVar2 != HBTRIE_RESULT_SUCCESS) {
    bVar3 = it->flags | 3;
  }
  it->flags = bVar3;
  return hVar2;
}

Assistant:

hbtrie_result hbtrie_prev(struct hbtrie_iterator *it,
                          void *key_buf,
                          size_t *keylen,
                          void *value_buf)
{
    hbtrie_result hr;

    if (HBTRIE_ITR_IS_REV(it) && HBTRIE_ITR_IS_FAILED(it)) {
        return HBTRIE_RESULT_FAIL;
    }

    struct list_elem *e = list_begin(&it->btreeit_list);
    struct btreeit_item *item = NULL;
    if (e) item = _get_entry(e, struct btreeit_item, le);

    hr = _hbtrie_prev(it, item, key_buf, keylen, value_buf, 0x0);
    HBTRIE_ITR_SET_REV(it);
    if (hr == HBTRIE_RESULT_SUCCESS) {
        HBTRIE_ITR_CLR_FAILED(it);
        HBTRIE_ITR_SET_MOVED(it);
    } else {
        HBTRIE_ITR_SET_FAILED(it);
    }
    return hr;
}